

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeySymToKeyMapping.cpp
# Opt level: O0

KeySym sf::priv::keyToKeySym(Key key)

{
  Key key_local;
  KeySym local_8;
  
  switch(key) {
  case A:
    local_8 = 0x61;
    break;
  case B:
    local_8 = 0x62;
    break;
  case C:
    local_8 = 99;
    break;
  case D:
    local_8 = 100;
    break;
  case E:
    local_8 = 0x65;
    break;
  case F:
    local_8 = 0x66;
    break;
  case G:
    local_8 = 0x67;
    break;
  case H:
    local_8 = 0x68;
    break;
  case I:
    local_8 = 0x69;
    break;
  case J:
    local_8 = 0x6a;
    break;
  case K:
    local_8 = 0x6b;
    break;
  case L:
    local_8 = 0x6c;
    break;
  case M:
    local_8 = 0x6d;
    break;
  case N:
    local_8 = 0x6e;
    break;
  case O:
    local_8 = 0x6f;
    break;
  case P:
    local_8 = 0x70;
    break;
  case Q:
    local_8 = 0x71;
    break;
  case R:
    local_8 = 0x72;
    break;
  case S:
    local_8 = 0x73;
    break;
  case T:
    local_8 = 0x74;
    break;
  case U:
    local_8 = 0x75;
    break;
  case V:
    local_8 = 0x76;
    break;
  case W:
    local_8 = 0x77;
    break;
  case X:
    local_8 = 0x78;
    break;
  case Y:
    local_8 = 0x79;
    break;
  case Z:
    local_8 = 0x7a;
    break;
  case Num0:
    local_8 = 0x30;
    break;
  case Num1:
    local_8 = 0x31;
    break;
  case Num2:
    local_8 = 0x32;
    break;
  case Num3:
    local_8 = 0x33;
    break;
  case Num4:
    local_8 = 0x34;
    break;
  case Num5:
    local_8 = 0x35;
    break;
  case Num6:
    local_8 = 0x36;
    break;
  case Num7:
    local_8 = 0x37;
    break;
  case Num8:
    local_8 = 0x38;
    break;
  case Num9:
    local_8 = 0x39;
    break;
  case Escape:
    local_8 = 0xff1b;
    break;
  case LControl:
    local_8 = 0xffe3;
    break;
  case LShift:
    local_8 = 0xffe1;
    break;
  case LAlt:
    local_8 = 0xffe9;
    break;
  case LSystem:
    local_8 = 0xffeb;
    break;
  case RControl:
    local_8 = 0xffe4;
    break;
  case RShift:
    local_8 = 0xffe2;
    break;
  case RAlt:
    local_8 = 0xffea;
    break;
  case RSystem:
    local_8 = 0xffec;
    break;
  case Menu:
    local_8 = 0xff67;
    break;
  case LBracket:
    local_8 = 0x5b;
    break;
  case RBracket:
    local_8 = 0x5d;
    break;
  case SemiColon:
    local_8 = 0x3b;
    break;
  case Comma:
    local_8 = 0x2c;
    break;
  case Period:
    local_8 = 0x2e;
    break;
  case Apostrophe:
    local_8 = 0x27;
    break;
  case Slash:
    local_8 = 0x2f;
    break;
  case BackSlash:
    local_8 = 0x5c;
    break;
  case Grave:
    local_8 = 0x60;
    break;
  case Equal:
    local_8 = 0x3d;
    break;
  case Dash:
    local_8 = 0x2d;
    break;
  case Space:
    local_8 = 0x20;
    break;
  case Enter:
    local_8 = 0xff0d;
    break;
  case BackSpace:
    local_8 = 0xff08;
    break;
  case Tab:
    local_8 = 0xff09;
    break;
  case PageUp:
    local_8 = 0xff55;
    break;
  case PageDown:
    local_8 = 0xff56;
    break;
  case End:
    local_8 = 0xff57;
    break;
  case Home:
    local_8 = 0xff50;
    break;
  case Insert:
    local_8 = 0xff63;
    break;
  case Delete:
    local_8 = 0xffff;
    break;
  case Add:
    local_8 = 0xffab;
    break;
  case Subtract:
    local_8 = 0xffad;
    break;
  case Multiply:
    local_8 = 0xffaa;
    break;
  case Divide:
    local_8 = 0xffaf;
    break;
  case Left:
    local_8 = 0xff51;
    break;
  case Right:
    local_8 = 0xff53;
    break;
  case Up:
    local_8 = 0xff52;
    break;
  case Down:
    local_8 = 0xff54;
    break;
  case Numpad0:
    local_8 = 0xff9e;
    break;
  case Numpad1:
    local_8 = 0xff9c;
    break;
  case Numpad2:
    local_8 = 0xff99;
    break;
  case Numpad3:
    local_8 = 0xff9b;
    break;
  case Numpad4:
    local_8 = 0xff96;
    break;
  case Numpad5:
    local_8 = 0xff9d;
    break;
  case Numpad6:
    local_8 = 0xff98;
    break;
  case Numpad7:
    local_8 = 0xff95;
    break;
  case Numpad8:
    local_8 = 0xff97;
    break;
  case Numpad9:
    local_8 = 0xff9a;
    break;
  case F1:
    local_8 = 0xffbe;
    break;
  case F2:
    local_8 = 0xffbf;
    break;
  case F3:
    local_8 = 0xffc0;
    break;
  case F4:
    local_8 = 0xffc1;
    break;
  case F5:
    local_8 = 0xffc2;
    break;
  case F6:
    local_8 = 0xffc3;
    break;
  case F7:
    local_8 = 0xffc4;
    break;
  case F8:
    local_8 = 0xffc5;
    break;
  case F9:
    local_8 = 0xffc6;
    break;
  case F10:
    local_8 = 0xffc7;
    break;
  case F11:
    local_8 = 0xffc8;
    break;
  case F12:
    local_8 = 0xffc9;
    break;
  case F13:
    local_8 = 0xffca;
    break;
  case F14:
    local_8 = 0xffcb;
    break;
  case F15:
    local_8 = 0xffcc;
    break;
  case Pause:
    local_8 = 0xff13;
    break;
  default:
    local_8 = 0;
  }
  return local_8;
}

Assistant:

KeySym keyToKeySym(Keyboard::Key key)
{
    switch (key)
    {
        case Keyboard::LShift:     return XK_Shift_L;
        case Keyboard::RShift:     return XK_Shift_R;
        case Keyboard::LControl:   return XK_Control_L;
        case Keyboard::RControl:   return XK_Control_R;
        case Keyboard::LAlt:       return XK_Alt_L;
        case Keyboard::RAlt:       return XK_Alt_R;
        case Keyboard::LSystem:    return XK_Super_L;
        case Keyboard::RSystem:    return XK_Super_R;
        case Keyboard::Menu:       return XK_Menu;
        case Keyboard::Escape:     return XK_Escape;
        case Keyboard::SemiColon:  return XK_semicolon;
        case Keyboard::Slash:      return XK_slash;
        case Keyboard::Equal:      return XK_equal;
        case Keyboard::Dash:       return XK_minus;
        case Keyboard::LBracket:   return XK_bracketleft;
        case Keyboard::RBracket:   return XK_bracketright;
        case Keyboard::Comma:      return XK_comma;
        case Keyboard::Period:     return XK_period;
        case Keyboard::Quote:      return XK_apostrophe;
        case Keyboard::BackSlash:  return XK_backslash;
        case Keyboard::Grave:      return XK_grave;
        case Keyboard::Space:      return XK_space;
        case Keyboard::Return:     return XK_Return;
        case Keyboard::BackSpace:  return XK_BackSpace;
        case Keyboard::Tab:        return XK_Tab;
        case Keyboard::PageUp:     return XK_Prior;
        case Keyboard::PageDown:   return XK_Next;
        case Keyboard::End:        return XK_End;
        case Keyboard::Home:       return XK_Home;
        case Keyboard::Insert:     return XK_Insert;
        case Keyboard::Delete:     return XK_Delete;
        case Keyboard::Add:        return XK_KP_Add;
        case Keyboard::Subtract:   return XK_KP_Subtract;
        case Keyboard::Multiply:   return XK_KP_Multiply;
        case Keyboard::Divide:     return XK_KP_Divide;
        case Keyboard::Pause:      return XK_Pause;
        case Keyboard::F1:         return XK_F1;
        case Keyboard::F2:         return XK_F2;
        case Keyboard::F3:         return XK_F3;
        case Keyboard::F4:         return XK_F4;
        case Keyboard::F5:         return XK_F5;
        case Keyboard::F6:         return XK_F6;
        case Keyboard::F7:         return XK_F7;
        case Keyboard::F8:         return XK_F8;
        case Keyboard::F9:         return XK_F9;
        case Keyboard::F10:        return XK_F10;
        case Keyboard::F11:        return XK_F11;
        case Keyboard::F12:        return XK_F12;
        case Keyboard::F13:        return XK_F13;
        case Keyboard::F14:        return XK_F14;
        case Keyboard::F15:        return XK_F15;
        case Keyboard::Left:       return XK_Left;
        case Keyboard::Right:      return XK_Right;
        case Keyboard::Up:         return XK_Up;
        case Keyboard::Down:       return XK_Down;
        case Keyboard::Numpad0:    return XK_KP_Insert;
        case Keyboard::Numpad1:    return XK_KP_End;
        case Keyboard::Numpad2:    return XK_KP_Down;
        case Keyboard::Numpad3:    return XK_KP_Page_Down;
        case Keyboard::Numpad4:    return XK_KP_Left;
        case Keyboard::Numpad5:    return XK_KP_Begin;
        case Keyboard::Numpad6:    return XK_KP_Right;
        case Keyboard::Numpad7:    return XK_KP_Home;
        case Keyboard::Numpad8:    return XK_KP_Up;
        case Keyboard::Numpad9:    return XK_KP_Page_Up;
        case Keyboard::A:          return XK_a;
        case Keyboard::B:          return XK_b;
        case Keyboard::C:          return XK_c;
        case Keyboard::D:          return XK_d;
        case Keyboard::E:          return XK_e;
        case Keyboard::F:          return XK_f;
        case Keyboard::G:          return XK_g;
        case Keyboard::H:          return XK_h;
        case Keyboard::I:          return XK_i;
        case Keyboard::J:          return XK_j;
        case Keyboard::K:          return XK_k;
        case Keyboard::L:          return XK_l;
        case Keyboard::M:          return XK_m;
        case Keyboard::N:          return XK_n;
        case Keyboard::O:          return XK_o;
        case Keyboard::P:          return XK_p;
        case Keyboard::Q:          return XK_q;
        case Keyboard::R:          return XK_r;
        case Keyboard::S:          return XK_s;
        case Keyboard::T:          return XK_t;
        case Keyboard::U:          return XK_u;
        case Keyboard::V:          return XK_v;
        case Keyboard::W:          return XK_w;
        case Keyboard::X:          return XK_x;
        case Keyboard::Y:          return XK_y;
        case Keyboard::Z:          return XK_z;
        case Keyboard::Num0:       return XK_0;
        case Keyboard::Num1:       return XK_1;
        case Keyboard::Num2:       return XK_2;
        case Keyboard::Num3:       return XK_3;
        case Keyboard::Num4:       return XK_4;
        case Keyboard::Num5:       return XK_5;
        case Keyboard::Num6:       return XK_6;
        case Keyboard::Num7:       return XK_7;
        case Keyboard::Num8:       return XK_8;
        case Keyboard::Num9:       return XK_9;
        default:                   return NoSymbol;
    }
}